

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_encoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialQuantizationAttributeEncoder::PrepareValues
          (SequentialQuantizationAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points)

{
  bool bVar1;
  PointAttribute *target_attribute;
  PointAttribute *attribute;
  SequentialAttributeEncoder *in_RSI;
  SequentialAttributeEncoder *in_RDI;
  int in_stack_0000003c;
  PointAttribute *in_stack_00000040;
  AttributeTransform *in_stack_00000048;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> portable_attribute;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *att;
  PointCloudEncoder **this_00;
  _Head_base<0UL,_draco::PointAttribute_*,_false> in_stack_ffffffffffffffc0;
  
  this_00 = &in_RDI[1].encoder_;
  target_attribute = SequentialAttributeEncoder::attribute(in_RDI);
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::size((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *)in_RSI);
  AttributeTransform::InitTransformedAttribute
            (in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  attribute = SequentialAttributeEncoder::attribute(in_RDI);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::get
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             in_RSI);
  bVar1 = AttributeQuantizationTransform::TransformAttribute
                    ((AttributeQuantizationTransform *)in_stack_ffffffffffffffc0._M_head_impl,
                     attribute,
                     (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                      *)in_RDI,target_attribute);
  if (bVar1) {
    att = (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
          &stack0xffffffffffffffc0;
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::unique_ptr
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               in_RSI,att);
    SequentialAttributeEncoder::SetPortableAttribute(in_RSI,att);
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               this_00);
  }
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             this_00);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeEncoder::PrepareValues(
    const std::vector<PointIndex> &point_ids, int num_points) {
  auto portable_attribute =
      attribute_quantization_transform_.InitTransformedAttribute(
          *attribute(), point_ids.size());
  if (!attribute_quantization_transform_.TransformAttribute(
          *(attribute()), point_ids, portable_attribute.get())) {
    return false;
  }
  SetPortableAttribute(std::move(portable_attribute));
  return true;
}